

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O0

complex<double> * c8mat_test_inverse(int n)

{
  complex<double> *pcVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 local_30 [8];
  complex<double> t;
  int j;
  int i;
  complex<double> *a;
  int n_local;
  
  uVar2 = 0;
  uVar3 = 0;
  std::complex<double>::complex((complex<double> *)local_30,0.0,0.0);
  pcVar1 = c8mat_test(n);
  for (t._M_value._8_4_ = 0; (int)t._M_value._8_4_ < n; t._M_value._8_4_ = t._M_value._8_4_ + 1) {
    for (t._M_value._12_4_ = 0; (int)t._M_value._12_4_ < (int)t._M_value._8_4_;
        t._M_value._12_4_ = t._M_value._12_4_ + 1) {
      std::conj<double>(pcVar1 + (t._M_value._12_4_ + t._M_value._8_4_ * n));
      local_30._4_4_ = extraout_XMM0_Db;
      local_30._0_4_ = extraout_XMM0_Da;
      t._M_value._4_4_ = uVar3;
      t._M_value._0_4_ = uVar2;
      std::conj<double>(pcVar1 + (t._M_value._8_4_ + t._M_value._12_4_ * n));
      *(ulong *)pcVar1[t._M_value._12_4_ + t._M_value._8_4_ * n]._M_value =
           CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
      *(ulong *)(pcVar1[t._M_value._12_4_ + t._M_value._8_4_ * n]._M_value + 8) =
           CONCAT44(uVar3,uVar2);
      *(undefined1 (*) [8])pcVar1[t._M_value._8_4_ + t._M_value._12_4_ * n]._M_value = local_30;
      *(undefined8 *)(pcVar1[t._M_value._8_4_ + t._M_value._12_4_ * n]._M_value + 8) =
           t._M_value._0_8_;
    }
  }
  return pcVar1;
}

Assistant:

complex <double> *c8mat_test_inverse ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    C8MAT_TEST_INVERSE returns the inverse of a test matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    04 April 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the matrix.
//
//    Output, complex <double> C8MAT_TEST_INVERSE[N*N], the matrix.
//
{
  complex <double> *a;
  int i;
  int j;
  complex <double> t;

  a = c8mat_test ( n );

  for ( j = 0; j < n; j++ )
  {
    for ( i = 0; i < j; i++ )
    {
      t        = conj ( a[i+j*n] );
      a[i+j*n] = conj ( a[j+i*n] );
      a[j+i*n] = t;
    }
  }
  return a;
}